

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall Diligent::ThreadPoolImpl::StopThreads(ThreadPoolImpl *this)

{
  pointer ptVar1;
  pointer ptVar2;
  thread *worker;
  pointer ptVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_TasksQueueMtx;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  LOCK();
  (this->m_Stop)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  std::condition_variable::notify_all();
  ptVar3 = (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ptVar3 != ptVar1) {
    do {
      std::thread::join();
      ptVar3 = ptVar3 + 1;
    } while (ptVar3 != ptVar1);
    ptVar3 = (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar1 = (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ptVar2 = ptVar3;
    if (ptVar1 != ptVar3) {
      do {
        if ((ptVar2->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar2 = ptVar2 + 1;
      } while (ptVar2 != ptVar1);
      (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar3;
    }
  }
  return;
}

Assistant:

StopThreads() override final
    {
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            // NB: even if the shared variable is atomic, it must be modified under the mutex
            //     in order to correctly publish the modification to the waiting thread.
            m_Stop.store(true);
        }
        // Note that if there are outstanding tasks in the queue, the threads may be woken up
        // by the corresponding notify_one() as notify*() and wait*() take place in a single
        // total order.
        m_NextTaskCond.notify_all();
        for (std::thread& worker : m_WorkerThreads)
            worker.join();

        m_WorkerThreads.clear();
    }